

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateMergingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  ulong uVar1;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableStringFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  uVar1 = google::protobuf::FieldDescriptor::has_presence();
  this_00 = local_18;
  if ((uVar1 & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "if (!other.get$capitalized_name$().isEmpty()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
              );
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&this->variables_,local_38);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "if (other.has$capitalized_name$()) {\n  $name$_ = other.$name$_;\n  $set_has_field_bit_builder$\n  $on_changed$\n}\n"
              );
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (this_00,&this->variables_,local_28);
  }
  return;
}

Assistant:

void ImmutableStringFieldGenerator::GenerateMergingCode(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    // Allow a slight breach of abstraction here in order to avoid forcing
    // all string fields to Strings when copying fields from a Message.
    printer->Print(variables_,
                   "if (other.has$capitalized_name$()) {\n"
                   "  $name$_ = other.$name$_;\n"
                   "  $set_has_field_bit_builder$\n"
                   "  $on_changed$\n"
                   "}\n");
  } else {
    printer->Print(variables_,
                   "if (!other.get$capitalized_name$().isEmpty()) {\n"
                   "  $name$_ = other.$name$_;\n"
                   "  $set_has_field_bit_builder$\n"
                   "  $on_changed$\n"
                   "}\n");
  }
}